

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O3

void ncnn::conv3x3s1_winograd63(Mat *bottom_blob,Mat *top_blob,Mat *AT,Mat *bias,int nT,Option *opt)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  size_t sVar4;
  size_t sVar5;
  float fVar6;
  float fVar7;
  int *piVar8;
  Mat *pMVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  undefined1 (*pauVar17) [32];
  undefined1 (*pauVar18) [16];
  void *pvVar19;
  float *pfVar20;
  float *pfVar21;
  void *pvVar22;
  int iVar23;
  uint uVar24;
  long lVar25;
  int iVar26;
  void *pvVar27;
  ulong uVar28;
  int iVar29;
  int iVar30;
  long lVar31;
  undefined8 *puVar32;
  undefined8 *puVar33;
  long lVar34;
  int iVar35;
  float *pfVar36;
  int iVar37;
  int iVar38;
  int K;
  int iVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  float fVar47;
  undefined1 auVar49 [16];
  float fVar48;
  float fVar54;
  float fVar56;
  undefined1 auVar50 [16];
  float fVar53;
  float fVar55;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar51 [32];
  float fVar57;
  float fVar61;
  undefined1 auVar52 [32];
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar68 [32];
  float fVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar82;
  float fVar83;
  float fVar88;
  float fVar89;
  float fVar90;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar130 [16];
  undefined1 in_ZMM11 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  int TILE_M;
  int TILE_K;
  int TILE_N;
  Mat m;
  float tmp [6] [8] [8];
  Allocator *_allocator;
  long local_880;
  ulong local_850;
  int local_810;
  uint local_80c;
  long local_808;
  ulong local_800;
  Mat *local_7f8;
  void *local_7f0;
  void *local_7e8;
  long local_7e0;
  void *local_7d8;
  void *local_7d0;
  Mat *local_7c8;
  int local_7c0;
  int local_7bc;
  int local_7b8;
  uint local_7b4;
  long local_7b0;
  ulong local_7a8;
  ulong local_7a0;
  ulong local_798;
  ulong local_790;
  long local_788;
  void *local_780;
  int local_774;
  Mat local_770;
  Mat local_720;
  ulong local_6d8;
  Mat local_6d0;
  ulong local_688;
  Mat *local_680;
  Mat *local_678;
  void *local_670;
  ulong local_668;
  undefined1 local_660 [8];
  float afStack_658 [4];
  float afStack_648 [2];
  Allocator *local_640;
  int iStack_638;
  int iStack_634;
  int iStack_630;
  undefined8 uStack_62c;
  float fStack_624;
  size_t local_620 [4];
  float local_600 [8];
  float local_5e0 [8];
  float local_5c0 [8];
  float local_5a0 [8];
  float local_580 [8];
  undefined8 auStack_560 [8];
  undefined8 auStack_520 [8];
  undefined8 auStack_4e0 [16];
  undefined1 auStack_460 [128];
  undefined1 auStack_3e0 [128];
  undefined1 auStack_360 [256];
  undefined1 auStack_260 [256];
  undefined1 auStack_160 [256];
  undefined1 auStack_60 [48];
  undefined1 auVar69 [32];
  undefined1 auVar81 [32];
  undefined1 auVar87 [32];
  undefined1 auVar98 [32];
  undefined1 auVar107 [32];
  
  uVar40 = top_blob->elempack * top_blob->c;
  uVar41 = ((top_blob->h + 5) / 6) * ((top_blob->w + 5) / 6);
  K = bottom_blob->elempack * bottom_blob->c;
  local_7c8 = top_blob;
  local_680 = AT;
  local_678 = bias;
  get_optimal_tile_mnk(uVar40,uVar41,K,(int *)&local_80c,(int *)&local_7b4,&local_7b8,nT);
  uVar42 = local_7b4;
  iVar10 = local_7b8;
  local_7c0 = (int)(uVar40 + local_80c + -1) / (int)local_80c;
  iVar37 = (int)(uVar41 + local_7b4 + -1) / (int)local_7b4;
  iVar39 = (local_7b8 + K + -1) / local_7b8;
  iVar26 = local_7b8 * local_7b4;
  _allocator = opt->workspace_allocator;
  local_720.cstep = 0;
  local_720.data = (void *)0x0;
  local_720.refcount._0_4_ = 0;
  local_720.refcount._4_4_ = 0;
  local_720.elemsize._0_4_ = 0;
  local_720.elemsize._4_4_ = 0;
  local_720.elempack = 0;
  local_720.allocator = (Allocator *)0x0;
  local_720.dims = 0;
  local_720.w = 0;
  local_720.h = 0;
  local_720.d = 0;
  local_720.c = 0;
  local_800 = (ulong)uVar41;
  local_688 = (ulong)uVar40;
  Mat::create(&local_720,iVar26,0x40,iVar39,iVar37,4,_allocator);
  iVar37 = iVar39 * iVar37;
  iVar26 = iVar26 * 0x40;
  if ((nT < 2) || (nT <= iVar37)) {
    local_620[0] = 0;
    local_660 = (undefined1  [8])0x0;
    afStack_658[0] = 0.0;
    afStack_658[1] = 0.0;
    afStack_658[2] = 0.0;
    afStack_658[3] = 0.0;
    afStack_648[0] = 0.0;
    local_640 = (Allocator *)0x0;
    iStack_638 = 0;
    iStack_634 = 0;
    iStack_630 = 0;
    uStack_62c._0_4_ = 0;
    uStack_62c._4_4_ = 0;
    Mat::create((Mat *)local_660,iVar26,1,nT,4,opt->workspace_allocator);
    if (0 < iVar37) {
      iVar26 = 0;
      do {
        iVar35 = uVar42 * (iVar26 / iVar39);
        iVar23 = iVar10 * (iVar26 % iVar39);
        uVar40 = (int)local_800 - iVar35;
        if ((int)uVar42 < (int)uVar40) {
          uVar40 = uVar42;
        }
        iVar38 = K - iVar23;
        if (iVar10 < iVar38) {
          iVar38 = iVar10;
        }
        iVar29 = get_omp_thread_num();
        local_770.elemsize = CONCAT44(afStack_658[3],afStack_658[2]);
        local_770.data =
             (void *)((long)iVar29 * local_620[0] * local_770.elemsize + (long)local_660);
        local_770.refcount._0_4_ = 0;
        local_770.refcount._4_4_ = 0;
        local_770.elempack = (int)afStack_648[0];
        local_770.allocator = local_640;
        local_770.w = iStack_634;
        local_770.h = iStack_630;
        local_770.d = 1;
        local_770.c = (int)uStack_62c;
        local_770.dims = iStack_638 + -1;
        local_770.cstep =
             (local_770.elemsize * (long)iStack_630 * (long)iStack_634 + 0xf & 0xfffffffffffffff0) /
             local_770.elemsize;
        if (iStack_638 == 4) {
          local_770.cstep = (long)iStack_630 * (long)iStack_634;
        }
        conv3x3s1_winograd63_transform_input_tile
                  (bottom_blob,&local_770,iVar35,uVar40,iVar23,iVar38,(int)_allocator);
        local_6d0.elemsize = CONCAT44(local_720.elemsize._4_4_,(undefined4)local_720.elemsize);
        local_6d0.cstep = (long)local_720.h * (long)local_720.w;
        local_6d0.data =
             (void *)((long)local_720.data +
                     (uint)(iVar26 % iVar39) * local_6d0.elemsize * local_6d0.cstep +
                     (long)(iVar26 / iVar39) * local_720.cstep * local_6d0.elemsize);
        local_6d0.refcount = (int *)0x0;
        local_6d0.elempack = local_720.elempack;
        local_6d0.allocator = local_720.allocator;
        local_6d0.dims = 2;
        local_6d0.w = local_720.w;
        local_6d0.h = local_720.h;
        local_6d0.d = 1;
        local_6d0.c = 1;
        transpose_pack_B_tile(&local_770,&local_6d0,0x40,uVar40,iVar38,(int)local_6d0.cstep);
        iVar26 = iVar26 + 1;
      } while (iVar37 != iVar26);
    }
    uVar28 = local_800;
    piVar8 = (int *)CONCAT44(afStack_658[1],afStack_658[0]);
    if (piVar8 == (int *)0x0) goto LAB_00234d47;
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 != 0) goto LAB_00234d47;
    if (local_640 != (Allocator *)0x0) {
      (*local_640->_vptr_Allocator[3])();
      goto LAB_00234d47;
    }
  }
  else {
    local_620[0] = 0;
    local_660 = (undefined1  [8])0x0;
    afStack_658[0] = 0.0;
    afStack_658[1] = 0.0;
    afStack_658[2] = 0.0;
    afStack_658[3] = 0.0;
    afStack_648[0] = 0.0;
    local_640 = (Allocator *)0x0;
    iStack_638 = 0;
    iStack_634 = 0;
    iStack_630 = 0;
    uStack_62c._0_4_ = 0;
    uStack_62c._4_4_ = 0;
    Mat::create((Mat *)local_660,iVar26,4,opt->workspace_allocator);
    if (0 < iVar37) {
      iVar26 = 0;
      do {
        iVar23 = uVar42 * (iVar26 / iVar39);
        iVar35 = iVar10 * (int)((long)iVar26 % (long)iVar39);
        uVar40 = (int)local_800 - iVar23;
        if ((int)uVar42 < (int)uVar40) {
          uVar40 = uVar42;
        }
        iVar38 = K - iVar35;
        if (iVar10 < iVar38) {
          iVar38 = iVar10;
        }
        conv3x3s1_winograd63_transform_input_tile
                  (bottom_blob,(Mat *)local_660,iVar23,uVar40,iVar35,iVar38,(int)_allocator);
        local_770.elemsize = CONCAT44(local_720.elemsize._4_4_,(undefined4)local_720.elemsize);
        local_770.cstep = (long)local_720.h * (long)local_720.w;
        local_770.data =
             (void *)((long)local_720.data +
                     ((long)iVar26 % (long)iVar39 & 0xffffffffU) * local_770.elemsize *
                     local_770.cstep +
                     (long)(iVar26 / iVar39) * local_720.cstep * local_770.elemsize);
        local_770.refcount._0_4_ = 0;
        local_770.refcount._4_4_ = 0;
        local_770.elempack = local_720.elempack;
        local_770.allocator = local_720.allocator;
        local_770.dims = 2;
        local_770.w = local_720.w;
        local_770.h = local_720.h;
        local_770.d = 1;
        local_770.c = 1;
        transpose_pack_B_tile((Mat *)local_660,&local_770,0x40,uVar40,iVar38,(int)local_770.cstep);
        iVar26 = iVar26 + 1;
      } while (iVar37 != iVar26);
    }
    uVar28 = local_800;
    piVar8 = (int *)CONCAT44(afStack_658[1],afStack_658[0]);
    if (piVar8 == (int *)0x0) goto LAB_00234d47;
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 != 0) goto LAB_00234d47;
    if (local_640 != (Allocator *)0x0) {
      (*local_640->_vptr_Allocator[3])();
      goto LAB_00234d47;
    }
  }
  uVar28 = local_800;
  if (local_660 != (undefined1  [8])0x0) {
    free((void *)local_660);
  }
LAB_00234d47:
  uVar42 = local_7b4;
  local_770.cstep = 0;
  local_770.data = (Allocator *)0x0;
  local_770.refcount._0_4_ = 0;
  local_770.refcount._4_4_ = 0;
  local_770.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_770.elempack = 0;
  local_770.h = 0;
  local_770.allocator = (Allocator *)local_770.data;
  local_770.dims = (int)local_770.refcount;
  local_770.w = local_770.refcount._4_4_;
  local_770.d = (int)local_770.refcount;
  local_770.c = local_770.elempack;
  Mat::create(&local_770,local_80c * local_7b4 * 0x40,1,nT,4,opt->workspace_allocator);
  if (0 < local_7c0) {
    local_810 = 0;
    do {
      uVar41 = local_80c;
      in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
      in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
      in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
      in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
      iVar10 = get_omp_thread_num();
      uVar24 = uVar41 * local_810;
      uVar40 = (int)local_688 - uVar24;
      if ((int)uVar41 < (int)uVar40) {
        uVar40 = uVar41;
      }
      if (0 < (int)uVar28) {
        local_7f8 = (Mat *)((long)(_func_int ***)local_770.data +
                           (long)iVar10 * local_770.cstep * local_770.elemsize);
        local_808 = (long)(int)uVar24;
        local_788 = (long)(int)uVar40;
        iVar10 = 0;
        local_798 = (ulong)uVar24;
        local_668 = (ulong)uVar40;
        do {
          pMVar9 = local_680;
          iVar37 = local_7b8;
          uVar41 = (int)uVar28 - iVar10;
          if ((int)uVar42 < (int)uVar41) {
            uVar41 = uVar42;
          }
          pvVar27 = (void *)(ulong)uVar41;
          if (0 < K) {
            iVar39 = (int)local_798;
            lVar12 = (long)(int)local_80c;
            uVar28 = local_798 & 0xffffffff;
            iVar23 = 0;
            iVar26 = K;
            do {
              iVar35 = iVar26;
              if (iVar37 < iVar26) {
                iVar35 = iVar37;
              }
              iStack_634 = pMVar9->w;
              iStack_630 = pMVar9->h;
              sVar4 = pMVar9->elemsize;
              afStack_648[0] = (float)pMVar9->elempack;
              local_640 = pMVar9->allocator;
              local_620[0] = (long)iStack_630 * (long)iStack_634;
              local_660 = (undefined1  [8])
                          ((long)pMVar9->data +
                          sVar4 * local_620[0] * (long)(iVar23 / iVar37) +
                          pMVar9->cstep *
                          (long)(int)((long)((ulong)(uint)(iVar39 >> 0x1f) << 0x20 | uVar28) /
                                     lVar12) * sVar4);
              afStack_658[0] = 0.0;
              afStack_658[1] = 0.0;
              afStack_658[2] = (float)sVar4;
              afStack_658[3] = (float)(sVar4 >> 0x20);
              iStack_638 = 2;
              uStack_62c._0_4_ = 1;
              uStack_62c._4_4_ = 1;
              local_6d0.elemsize = CONCAT44(local_720.elemsize._4_4_,(undefined4)local_720.elemsize)
              ;
              local_6d0.cstep = (long)local_720.h * (long)local_720.w;
              local_6d0.data =
                   (void *)((long)local_720.data +
                           local_6d0.elemsize * local_6d0.cstep * (long)(iVar23 / iVar37) +
                           local_720.cstep * (long)(iVar10 / (int)uVar42) * local_6d0.elemsize);
              local_6d0.refcount = (int *)0x0;
              local_6d0.elempack = local_720.elempack;
              local_6d0.allocator = local_720.allocator;
              local_6d0.dims = 2;
              local_6d0.w = local_720.w;
              local_6d0.h = local_720.h;
              local_6d0.d = 1;
              local_6d0.c = 1;
              iVar26 = -(iVar37 - iVar26);
              in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
              in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
              in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
              in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
              gemm_transB_packed_tile
                        ((Mat *)local_660,&local_6d0,local_7f8,0x40,uVar40,uVar41,iVar23,iVar35);
              iVar23 = iVar23 + iVar37;
            } while (iVar23 < K);
          }
          iVar37 = local_7c8->w;
          iVar26 = local_7c8->elempack;
          uVar24 = (int)local_7c8->cstep * iVar26;
          local_7a0 = (ulong)uVar24;
          uVar42 = (iVar37 + 5) / 6;
          local_7a8 = (ulong)uVar42;
          local_7bc = uVar41 * 0x40;
          uVar28 = 0;
          local_7f0 = local_678->data;
          local_7b0 = (long)local_7c8->h;
          if (7 < (int)uVar40) {
            local_7e8 = (void *)(long)(int)(uVar41 * 0x18);
            local_7e0 = (long)(int)uVar24;
            lVar31 = (long)(int)(uVar24 * 2);
            lVar12 = (long)(int)(uVar24 * 3);
            lVar13 = (long)(int)(uVar24 * 4);
            lVar14 = (long)(int)(uVar24 * 5);
            lVar15 = (long)(int)(uVar24 * 6);
            lVar16 = (long)(int)(uVar24 * 7);
            local_774 = uVar41 * 0x200;
            local_670 = (void *)((long)local_7f0 + local_808 * 4);
            local_790 = 0;
            uVar28 = 0;
            do {
              local_6d8 = uVar28;
              if (local_7f0 == (void *)0x0) {
                auVar46 = ZEXT1632(ZEXT816(0) << 0x40);
              }
              else {
                auVar46 = *(undefined1 (*) [32])((long)local_670 + local_6d8 * 4);
              }
              if (0 < (int)uVar41) {
                pfVar20 = (float *)((long)&local_7f8->data + (long)(int)local_790 * 4);
                local_7d8 = (void *)(long)(((int)local_798 + (int)local_6d8) / iVar26);
                pvVar19 = (void *)0x0;
                do {
                  local_7d0 = pvVar19;
                  iVar39 = iVar10 + (int)local_7d0;
                  lVar25 = -0x100;
                  pfVar21 = pfVar20;
                  auVar132 = in_ZMM11;
                  do {
                    auVar51 = *(undefined1 (*) [32])(pfVar21 + (int)(uVar41 * 8));
                    auVar68 = *(undefined1 (*) [32])(pfVar21 + (int)(uVar41 * 0x10));
                    auVar52 = *(undefined1 (*) [32])(pfVar21 + (long)local_7e8);
                    auVar106 = *(undefined1 (*) [32])(pfVar21 + (int)(uVar41 << 5));
                    auVar124 = *(undefined1 (*) [32])(pfVar21 + (int)(uVar41 * 0x28));
                    auVar127 = *(undefined1 (*) [32])(pfVar21 + (int)(uVar41 * 0x30));
                    fVar108 = auVar68._0_4_ + auVar51._0_4_;
                    fVar110 = auVar68._4_4_ + auVar51._4_4_;
                    fVar112 = auVar68._8_4_ + auVar51._8_4_;
                    fVar114 = auVar68._12_4_ + auVar51._12_4_;
                    fVar116 = auVar68._16_4_ + auVar51._16_4_;
                    fVar118 = auVar68._20_4_ + auVar51._20_4_;
                    fVar120 = auVar68._24_4_ + auVar51._24_4_;
                    fVar121 = auVar68._28_4_ + auVar51._28_4_;
                    auVar51 = vsubps_avx(auVar51,auVar68);
                    fVar62 = auVar106._0_4_ + auVar52._0_4_;
                    fVar70 = auVar106._4_4_ + auVar52._4_4_;
                    fVar71 = auVar106._8_4_ + auVar52._8_4_;
                    fVar72 = auVar106._12_4_ + auVar52._12_4_;
                    fVar73 = auVar106._16_4_ + auVar52._16_4_;
                    fVar74 = auVar106._20_4_ + auVar52._20_4_;
                    fVar75 = auVar106._24_4_ + auVar52._24_4_;
                    fVar76 = auVar106._28_4_ + auVar52._28_4_;
                    auVar68 = vsubps_avx(auVar52,auVar106);
                    fVar83 = auVar127._0_4_ + auVar124._0_4_;
                    fVar88 = auVar127._4_4_ + auVar124._4_4_;
                    fVar89 = auVar127._8_4_ + auVar124._8_4_;
                    fVar90 = auVar127._12_4_ + auVar124._12_4_;
                    fVar91 = auVar127._16_4_ + auVar124._16_4_;
                    fVar92 = auVar127._20_4_ + auVar124._20_4_;
                    fVar93 = auVar127._24_4_ + auVar124._24_4_;
                    fVar94 = auVar127._28_4_ + auVar124._28_4_;
                    auVar52 = vsubps_avx(auVar124,auVar127);
                    auVar106._0_4_ = fVar83 * 32.0 + fVar62 + fVar108 + *pfVar21;
                    auVar106._4_4_ = fVar88 * 32.0 + fVar70 + fVar110 + pfVar21[1];
                    auVar106._8_4_ = fVar89 * 32.0 + fVar71 + fVar112 + pfVar21[2];
                    auVar106._12_4_ = fVar90 * 32.0 + fVar72 + fVar114 + pfVar21[3];
                    auVar106._16_4_ = fVar91 * 32.0 + fVar73 + fVar116 + pfVar21[4];
                    auVar106._20_4_ = fVar92 * 32.0 + fVar74 + fVar118 + pfVar21[5];
                    auVar106._24_4_ = fVar93 * 32.0 + fVar75 + fVar120 + pfVar21[6];
                    auVar106._28_4_ = in_ZMM8._28_4_ + fVar76 + fVar121 + pfVar21[7];
                    fVar44 = auVar68._0_4_;
                    fVar6 = auVar68._4_4_;
                    fVar48 = auVar68._8_4_;
                    fVar56 = auVar68._12_4_;
                    fVar53 = auVar68._16_4_;
                    fVar57 = auVar68._20_4_;
                    fVar59 = auVar68._24_4_;
                    fVar61 = auVar68._28_4_;
                    fVar43 = auVar51._0_4_;
                    fVar7 = auVar51._4_4_;
                    fVar54 = auVar51._8_4_;
                    fVar47 = auVar51._12_4_;
                    fVar55 = auVar51._16_4_;
                    fVar58 = auVar51._20_4_;
                    fVar60 = auVar51._24_4_;
                    fVar77 = auVar51._28_4_;
                    fVar82 = auVar52._0_4_;
                    fVar109 = auVar52._4_4_;
                    fVar111 = auVar52._8_4_;
                    fVar113 = auVar52._12_4_;
                    fVar115 = auVar52._16_4_;
                    fVar117 = auVar52._20_4_;
                    fVar119 = auVar52._24_4_;
                    auVar124._0_4_ = fVar44 + fVar44 + fVar43 + fVar82 * 16.0;
                    auVar124._4_4_ = fVar6 + fVar6 + fVar7 + fVar109 * 16.0;
                    auVar124._8_4_ = fVar48 + fVar48 + fVar54 + fVar111 * 16.0;
                    auVar124._12_4_ = fVar56 + fVar56 + fVar47 + fVar113 * 16.0;
                    auVar124._16_4_ = fVar53 + fVar53 + fVar55 + fVar115 * 16.0;
                    auVar124._20_4_ = fVar57 + fVar57 + fVar58 + fVar117 * 16.0;
                    auVar124._24_4_ = fVar59 + fVar59 + fVar60 + fVar119 * 16.0;
                    auVar124._28_4_ = fVar61 + fVar61 + fVar77 + in_ZMM9._28_4_;
                    in_ZMM8 = ZEXT3264(auVar124);
                    auVar127._0_4_ = fVar62 * 4.0 + fVar108 + fVar83 * 8.0;
                    auVar127._4_4_ = fVar70 * 4.0 + fVar110 + fVar88 * 8.0;
                    auVar127._8_4_ = fVar71 * 4.0 + fVar112 + fVar89 * 8.0;
                    auVar127._12_4_ = fVar72 * 4.0 + fVar114 + fVar90 * 8.0;
                    auVar127._16_4_ = fVar73 * 4.0 + fVar116 + fVar91 * 8.0;
                    auVar127._20_4_ = fVar74 * 4.0 + fVar118 + fVar92 * 8.0;
                    auVar127._24_4_ = fVar75 * 4.0 + fVar120 + fVar93 * 8.0;
                    auVar127._28_4_ = in_ZMM9._28_4_ + fVar121 + in_ZMM10._28_4_;
                    in_ZMM9 = ZEXT3264(auVar127);
                    auVar131._0_4_ = fVar82 * 4.0;
                    auVar131._4_4_ = fVar109 * 4.0;
                    auVar131._8_4_ = fVar111 * 4.0;
                    auVar131._12_4_ = fVar113 * 4.0;
                    auVar131._16_4_ = fVar115 * 4.0;
                    auVar131._20_4_ = fVar117 * 4.0;
                    auVar131._28_36_ = auVar132._28_36_;
                    auVar131._24_4_ = fVar119 * 4.0;
                    in_ZMM11 = ZEXT3264(auVar131._0_32_);
                    auVar129._0_4_ = fVar44 * 8.0 + fVar43 + auVar131._0_4_;
                    auVar129._4_4_ = fVar6 * 8.0 + fVar7 + auVar131._4_4_;
                    auVar129._8_4_ = fVar48 * 8.0 + fVar54 + auVar131._8_4_;
                    auVar129._12_4_ = fVar56 * 8.0 + fVar47 + auVar131._12_4_;
                    auVar129._16_4_ = fVar53 * 8.0 + fVar55 + auVar131._16_4_;
                    auVar129._20_4_ = fVar57 * 8.0 + fVar58 + auVar131._20_4_;
                    auVar129._24_4_ = fVar59 * 8.0 + fVar60 + auVar131._24_4_;
                    auVar129._28_4_ = in_ZMM10._28_4_ + fVar77 + auVar132._28_4_;
                    in_ZMM10 = ZEXT3264(auVar129);
                    auVar68._0_4_ = fVar62 * 16.0 + fVar108 + fVar83 + fVar83;
                    auVar68._4_4_ = fVar70 * 16.0 + fVar110 + fVar88 + fVar88;
                    auVar68._8_4_ = fVar71 * 16.0 + fVar112 + fVar89 + fVar89;
                    auVar68._12_4_ = fVar72 * 16.0 + fVar114 + fVar90 + fVar90;
                    auVar68._16_4_ = fVar73 * 16.0 + fVar116 + fVar91 + fVar91;
                    auVar68._20_4_ = fVar74 * 16.0 + fVar118 + fVar92 + fVar92;
                    auVar68._24_4_ = fVar75 * 16.0 + fVar120 + fVar93 + fVar93;
                    auVar68._28_4_ = fVar76 + fVar121 + fVar94 + fVar94;
                    pfVar36 = pfVar21 + (int)(uVar41 * 0x38);
                    auVar51._0_4_ = fVar44 * 32.0 + fVar43 + *pfVar36 + fVar82;
                    auVar51._4_4_ = fVar6 * 32.0 + fVar7 + pfVar36[1] + fVar109;
                    auVar51._8_4_ = fVar48 * 32.0 + fVar54 + pfVar36[2] + fVar111;
                    auVar51._12_4_ = fVar56 * 32.0 + fVar47 + pfVar36[3] + fVar113;
                    auVar51._16_4_ = fVar53 * 32.0 + fVar55 + pfVar36[4] + fVar115;
                    auVar51._20_4_ = fVar57 * 32.0 + fVar58 + pfVar36[5] + fVar117;
                    auVar51._24_4_ = fVar59 * 32.0 + fVar60 + pfVar36[6] + fVar119;
                    auVar51._28_4_ = fVar61 + fVar77 + pfVar36[7] + auVar52._28_4_;
                    *(undefined1 (*) [32])((long)auStack_560 + lVar25) = auVar106;
                    *(undefined1 (*) [32])(auStack_460 + lVar25) = auVar124;
                    *(undefined1 (*) [32])(auStack_360 + lVar25) = auVar127;
                    *(undefined1 (*) [32])(auStack_260 + lVar25) = auVar129;
                    *(undefined1 (*) [32])(auStack_160 + lVar25) = auVar68;
                    *(undefined1 (*) [32])(auStack_60 + lVar25) = auVar51;
                    pfVar21 = pfVar21 + local_7bc;
                    lVar25 = lVar25 + 0x20;
                    auVar132 = in_ZMM11;
                  } while (lVar25 != 0);
                  iVar38 = iVar39 % (int)uVar42;
                  lVar34 = (long)((iVar39 / (int)uVar42) * 6);
                  pauVar17 = (undefined1 (*) [32])
                             ((long)local_7c8->data +
                             (long)(iVar38 * 6 * iVar26) * 4 +
                             (long)local_7c8->w * local_7c8->elemsize * lVar34 +
                             local_7c8->cstep * (long)local_7d8 * local_7c8->elemsize);
                  iVar29 = iVar38 * 6 + 1;
                  iVar39 = iVar38 * 6 + 2;
                  iVar23 = iVar38 * 6 + 3;
                  iVar35 = iVar38 * 6 + 4;
                  iVar38 = iVar38 * 6 + 5;
                  pfVar21 = local_580;
                  lVar25 = 0;
                  do {
                    if (lVar25 < local_7b0 - lVar34) {
                      auVar51 = *(undefined1 (*) [32])(pfVar21 + -0x30);
                      auVar68 = *(undefined1 (*) [32])(pfVar21 + -0x28);
                      auVar52 = *(undefined1 (*) [32])(pfVar21 + -0x20);
                      auVar106 = *(undefined1 (*) [32])(pfVar21 + -0x18);
                      auVar124 = *(undefined1 (*) [32])(pfVar21 + -0x10);
                      auVar127 = *(undefined1 (*) [32])(pfVar21 + -8);
                      auVar129 = vsubps_avx(auVar51,auVar68);
                      fVar71 = auVar106._0_4_ + auVar52._0_4_;
                      fVar72 = auVar106._4_4_ + auVar52._4_4_;
                      fVar73 = auVar106._8_4_ + auVar52._8_4_;
                      fVar74 = auVar106._12_4_ + auVar52._12_4_;
                      fVar75 = auVar106._16_4_ + auVar52._16_4_;
                      fVar76 = auVar106._20_4_ + auVar52._20_4_;
                      fVar83 = auVar106._24_4_ + auVar52._24_4_;
                      auVar69 = vsubps_avx(auVar52,auVar106);
                      in_ZMM9 = ZEXT3264(auVar69);
                      fVar88 = auVar127._0_4_ + auVar124._0_4_;
                      fVar89 = auVar127._4_4_ + auVar124._4_4_;
                      fVar90 = auVar127._8_4_ + auVar124._8_4_;
                      fVar91 = auVar127._12_4_ + auVar124._12_4_;
                      fVar92 = auVar127._16_4_ + auVar124._16_4_;
                      fVar93 = auVar127._20_4_ + auVar124._20_4_;
                      fVar94 = auVar127._24_4_ + auVar124._24_4_;
                      fVar108 = auVar127._28_4_ + auVar124._28_4_;
                      in_ZMM10 = ZEXT3264(CONCAT428(fVar108,CONCAT424(fVar94,CONCAT420(fVar93,
                                                  CONCAT416(fVar92,CONCAT412(fVar91,CONCAT48(fVar90,
                                                  CONCAT44(fVar89,fVar88))))))));
                      auVar124 = vsubps_avx(auVar124,auVar127);
                      in_ZMM11 = ZEXT3264(auVar124);
                      fVar47 = auVar51._0_4_ + auVar46._0_4_ + auVar68._0_4_;
                      fVar53 = auVar51._4_4_ + auVar46._4_4_ + auVar68._4_4_;
                      fVar55 = auVar51._8_4_ + auVar46._8_4_ + auVar68._8_4_;
                      fVar57 = auVar51._12_4_ + auVar46._12_4_ + auVar68._12_4_;
                      fVar58 = auVar51._16_4_ + auVar46._16_4_ + auVar68._16_4_;
                      fVar59 = auVar51._20_4_ + auVar46._20_4_ + auVar68._20_4_;
                      fVar60 = auVar51._24_4_ + auVar46._24_4_ + auVar68._24_4_;
                      fVar61 = auVar51._28_4_ + auVar46._28_4_ + auVar68._28_4_;
                      fVar82 = auVar106._28_4_ + auVar52._28_4_ + auVar52._28_4_;
                      auVar99._0_4_ = fVar47 + pfVar21[-0x38] + fVar71 + fVar88 * 32.0;
                      auVar99._4_4_ = fVar53 + pfVar21[-0x37] + fVar72 + fVar89 * 32.0;
                      auVar99._8_4_ = fVar55 + pfVar21[-0x36] + fVar73 + fVar90 * 32.0;
                      auVar99._12_4_ = fVar57 + pfVar21[-0x35] + fVar74 + fVar91 * 32.0;
                      auVar107._16_4_ = fVar58 + pfVar21[-0x34] + fVar75 + fVar92 * 32.0;
                      auVar107._0_16_ = auVar99;
                      auVar107._20_4_ = fVar59 + pfVar21[-0x33] + fVar76 + fVar93 * 32.0;
                      auVar107._24_4_ = fVar60 + pfVar21[-0x32] + fVar83 + fVar94 * 32.0;
                      auVar107._28_4_ = fVar61 + pfVar21[-0x31] + fVar82;
                      fVar44 = auVar69._0_4_;
                      fVar43 = auVar69._4_4_;
                      fVar6 = auVar69._8_4_;
                      fVar7 = auVar69._12_4_;
                      fVar48 = auVar69._16_4_;
                      fVar54 = auVar69._20_4_;
                      fVar56 = auVar69._24_4_;
                      fVar110 = auVar124._0_4_;
                      fVar112 = auVar124._4_4_;
                      fVar114 = auVar124._8_4_;
                      fVar116 = auVar124._12_4_;
                      fVar118 = auVar124._16_4_;
                      fVar120 = auVar124._20_4_;
                      fVar121 = auVar124._24_4_;
                      fVar109 = auVar129._0_4_ + auVar46._0_4_;
                      fVar111 = auVar129._4_4_ + auVar46._4_4_;
                      fVar113 = auVar129._8_4_ + auVar46._8_4_;
                      fVar115 = auVar129._12_4_ + auVar46._12_4_;
                      fVar117 = auVar129._16_4_ + auVar46._16_4_;
                      fVar119 = auVar129._20_4_ + auVar46._20_4_;
                      fVar62 = auVar129._24_4_ + auVar46._24_4_;
                      fVar70 = auVar129._28_4_ + auVar46._28_4_;
                      fVar77 = auVar69._28_4_ + auVar69._28_4_ + fVar70;
                      auVar95._0_4_ = fVar44 + fVar44 + fVar109 + fVar110 * 16.0;
                      auVar95._4_4_ = fVar43 + fVar43 + fVar111 + fVar112 * 16.0;
                      auVar95._8_4_ = fVar6 + fVar6 + fVar113 + fVar114 * 16.0;
                      auVar95._12_4_ = fVar7 + fVar7 + fVar115 + fVar116 * 16.0;
                      auVar98._16_4_ = fVar48 + fVar48 + fVar117 + fVar118 * 16.0;
                      auVar98._0_16_ = auVar95;
                      auVar98._20_4_ = fVar54 + fVar54 + fVar119 + fVar120 * 16.0;
                      auVar98._24_4_ = fVar56 + fVar56 + fVar62 + fVar121 * 16.0;
                      auVar98._28_4_ = fVar77 + fVar82;
                      fVar77 = fVar77 + fVar61;
                      auVar84._0_4_ = fVar71 * 4.0 + fVar47 + fVar88 * 8.0;
                      auVar84._4_4_ = fVar72 * 4.0 + fVar53 + fVar89 * 8.0;
                      auVar84._8_4_ = fVar73 * 4.0 + fVar55 + fVar90 * 8.0;
                      auVar84._12_4_ = fVar74 * 4.0 + fVar57 + fVar91 * 8.0;
                      auVar87._16_4_ = fVar75 * 4.0 + fVar58 + fVar92 * 8.0;
                      auVar87._0_16_ = auVar84;
                      auVar87._20_4_ = fVar76 * 4.0 + fVar59 + fVar93 * 8.0;
                      auVar87._24_4_ = fVar83 * 4.0 + fVar60 + fVar94 * 8.0;
                      auVar87._28_4_ = fVar77 + fVar82;
                      fVar77 = fVar77 + fVar70;
                      auVar78._0_4_ = fVar44 * 8.0 + fVar109 + fVar110 * 4.0;
                      auVar78._4_4_ = fVar43 * 8.0 + fVar111 + fVar112 * 4.0;
                      auVar78._8_4_ = fVar6 * 8.0 + fVar113 + fVar114 * 4.0;
                      auVar78._12_4_ = fVar7 * 8.0 + fVar115 + fVar116 * 4.0;
                      auVar81._16_4_ = fVar48 * 8.0 + fVar117 + fVar118 * 4.0;
                      auVar81._0_16_ = auVar78;
                      auVar81._20_4_ = fVar54 * 8.0 + fVar119 + fVar120 * 4.0;
                      auVar81._24_4_ = fVar56 * 8.0 + fVar62 + fVar121 * 4.0;
                      auVar81._28_4_ = fVar77 + fVar82;
                      in_ZMM8 = ZEXT3264(CONCAT428(fVar108 + fVar108,
                                                   CONCAT424(fVar94 + fVar94,
                                                             CONCAT420(fVar93 + fVar93,
                                                                       CONCAT416(fVar92 + fVar92,
                                                                                 CONCAT412(fVar91 + 
                                                  fVar91,CONCAT48(fVar90 + fVar90,
                                                                  CONCAT44(fVar89 + fVar89,
                                                                           fVar88 + fVar88))))))));
                      fVar61 = fVar108 + fVar108 + fVar61;
                      auVar63._0_4_ = fVar71 * 16.0 + fVar88 + fVar88 + fVar47;
                      auVar63._4_4_ = fVar72 * 16.0 + fVar89 + fVar89 + fVar53;
                      auVar63._8_4_ = fVar73 * 16.0 + fVar90 + fVar90 + fVar55;
                      auVar63._12_4_ = fVar74 * 16.0 + fVar91 + fVar91 + fVar57;
                      auVar69._16_4_ = fVar75 * 16.0 + fVar92 + fVar92 + fVar58;
                      auVar69._0_16_ = auVar63;
                      auVar69._20_4_ = fVar76 * 16.0 + fVar93 + fVar93 + fVar59;
                      auVar69._24_4_ = fVar83 * 16.0 + fVar94 + fVar94 + fVar60;
                      auVar69._28_4_ = fVar77 + fVar61;
                      auVar45._0_4_ = fVar110 + fVar44 * 32.0 + fVar109 + *pfVar21;
                      auVar45._4_4_ = fVar112 + fVar43 * 32.0 + fVar111 + pfVar21[1];
                      auVar45._8_4_ = fVar114 + fVar6 * 32.0 + fVar113 + pfVar21[2];
                      auVar45._12_4_ = fVar116 + fVar7 * 32.0 + fVar115 + pfVar21[3];
                      auVar52._16_4_ = fVar118 + fVar48 * 32.0 + fVar117 + pfVar21[4];
                      auVar52._0_16_ = auVar45;
                      auVar52._20_4_ = fVar120 + fVar54 * 32.0 + fVar119 + pfVar21[5];
                      auVar52._24_4_ = fVar121 + fVar56 * 32.0 + fVar62 + pfVar21[6];
                      auVar52._28_4_ = auVar124._28_4_ + fVar61 + fVar70 + pfVar21[7];
                      auVar128 = auVar107._16_16_;
                      auVar125 = auVar98._16_16_;
                      auVar122 = auVar87._16_16_;
                      auVar100 = auVar81._16_16_;
                      auVar64 = auVar69._16_16_;
                      auVar49 = auVar52._16_16_;
                      if (iVar26 == 1) {
                        *(float *)*pauVar17 = auVar99._0_4_;
                        uVar3 = vextractps_avx(auVar99,1);
                        *(undefined4 *)(*pauVar17 + local_7e0 * 4) = uVar3;
                        uVar3 = vextractps_avx(auVar99,2);
                        *(undefined4 *)(*pauVar17 + lVar31 * 4) = uVar3;
                        uVar3 = vextractps_avx(auVar99,3);
                        *(undefined4 *)(*pauVar17 + lVar12 * 4) = uVar3;
                        *(float *)(*pauVar17 + lVar13 * 4) = auVar107._16_4_;
                        uVar3 = vextractps_avx(auVar128,1);
                        *(undefined4 *)(*pauVar17 + lVar14 * 4) = uVar3;
                        uVar3 = vextractps_avx(auVar128,2);
                        *(undefined4 *)(*pauVar17 + lVar15 * 4) = uVar3;
                        uVar3 = vextractps_avx(auVar128,3);
                        *(undefined4 *)(*pauVar17 + lVar16 * 4) = uVar3;
                        if (iVar29 < iVar37) {
                          *(float *)(*pauVar17 + 4) = auVar95._0_4_;
                          uVar3 = vextractps_avx(auVar95,1);
                          *(undefined4 *)(*pauVar17 + local_7e0 * 4 + 4) = uVar3;
                          uVar3 = vextractps_avx(auVar95,2);
                          *(undefined4 *)(*pauVar17 + lVar31 * 4 + 4) = uVar3;
                          uVar3 = vextractps_avx(auVar95,3);
                          *(undefined4 *)(*pauVar17 + lVar12 * 4 + 4) = uVar3;
                          *(float *)(*pauVar17 + lVar13 * 4 + 4) = auVar98._16_4_;
                          uVar3 = vextractps_avx(auVar125,1);
                          *(undefined4 *)(*pauVar17 + lVar14 * 4 + 4) = uVar3;
                          uVar3 = vextractps_avx(auVar125,2);
                          *(undefined4 *)(*pauVar17 + lVar15 * 4 + 4) = uVar3;
                          uVar3 = vextractps_avx(auVar125,3);
                          *(undefined4 *)(*pauVar17 + lVar16 * 4 + 4) = uVar3;
                        }
                        if (iVar39 < iVar37) {
                          *(float *)(*pauVar17 + 8) = auVar84._0_4_;
                          uVar3 = vextractps_avx(auVar84,1);
                          *(undefined4 *)(*pauVar17 + local_7e0 * 4 + 8) = uVar3;
                          uVar3 = vextractps_avx(auVar84,2);
                          *(undefined4 *)(*pauVar17 + lVar31 * 4 + 8) = uVar3;
                          uVar3 = vextractps_avx(auVar84,3);
                          *(undefined4 *)(*pauVar17 + lVar12 * 4 + 8) = uVar3;
                          *(float *)(*pauVar17 + lVar13 * 4 + 8) = auVar87._16_4_;
                          uVar3 = vextractps_avx(auVar122,1);
                          *(undefined4 *)(*pauVar17 + lVar14 * 4 + 8) = uVar3;
                          uVar3 = vextractps_avx(auVar122,2);
                          *(undefined4 *)(*pauVar17 + lVar15 * 4 + 8) = uVar3;
                          uVar3 = vextractps_avx(auVar122,3);
                          *(undefined4 *)(*pauVar17 + lVar16 * 4 + 8) = uVar3;
                        }
                        if (iVar23 < iVar37) {
                          *(float *)(*pauVar17 + 0xc) = auVar78._0_4_;
                          uVar3 = vextractps_avx(auVar78,1);
                          *(undefined4 *)(*pauVar17 + local_7e0 * 4 + 0xc) = uVar3;
                          uVar3 = vextractps_avx(auVar78,2);
                          *(undefined4 *)(*pauVar17 + lVar31 * 4 + 0xc) = uVar3;
                          uVar3 = vextractps_avx(auVar78,3);
                          *(undefined4 *)(*pauVar17 + lVar12 * 4 + 0xc) = uVar3;
                          *(float *)(*pauVar17 + lVar13 * 4 + 0xc) = auVar81._16_4_;
                          uVar3 = vextractps_avx(auVar100,1);
                          *(undefined4 *)(*pauVar17 + lVar14 * 4 + 0xc) = uVar3;
                          uVar3 = vextractps_avx(auVar100,2);
                          *(undefined4 *)(*pauVar17 + lVar15 * 4 + 0xc) = uVar3;
                          uVar3 = vextractps_avx(auVar100,3);
                          *(undefined4 *)(*pauVar17 + lVar16 * 4 + 0xc) = uVar3;
                        }
                        if (iVar35 < iVar37) {
                          *(float *)(*pauVar17 + 0x10) = auVar63._0_4_;
                          uVar3 = vextractps_avx(auVar63,1);
                          *(undefined4 *)(*pauVar17 + local_7e0 * 4 + 0x10) = uVar3;
                          uVar3 = vextractps_avx(auVar63,2);
                          *(undefined4 *)(*pauVar17 + lVar31 * 4 + 0x10) = uVar3;
                          uVar3 = vextractps_avx(auVar63,3);
                          *(undefined4 *)(*pauVar17 + lVar12 * 4 + 0x10) = uVar3;
                          *(float *)(*pauVar17 + lVar13 * 4 + 0x10) = auVar69._16_4_;
                          uVar3 = vextractps_avx(auVar64,1);
                          *(undefined4 *)(*pauVar17 + lVar14 * 4 + 0x10) = uVar3;
                          uVar3 = vextractps_avx(auVar64,2);
                          *(undefined4 *)(*pauVar17 + lVar15 * 4 + 0x10) = uVar3;
                          uVar3 = vextractps_avx(auVar64,3);
                          *(undefined4 *)(*pauVar17 + lVar16 * 4 + 0x10) = uVar3;
                        }
                        if (iVar38 < iVar37) {
                          *(float *)(*pauVar17 + 0x14) = auVar45._0_4_;
                          uVar3 = vextractps_avx(auVar45,1);
                          *(undefined4 *)(*pauVar17 + local_7e0 * 4 + 0x14) = uVar3;
                          uVar3 = vextractps_avx(auVar45,2);
                          *(undefined4 *)(*pauVar17 + lVar31 * 4 + 0x14) = uVar3;
                          uVar3 = vextractps_avx(auVar45,3);
                          *(undefined4 *)(*pauVar17 + lVar12 * 4 + 0x14) = uVar3;
                          *(float *)(*pauVar17 + lVar13 * 4 + 0x14) = auVar52._16_4_;
                          uVar3 = vextractps_avx(auVar49,1);
                          *(undefined4 *)(*pauVar17 + lVar14 * 4 + 0x14) = uVar3;
                          uVar3 = vextractps_avx(auVar49,2);
                          *(undefined4 *)(*pauVar17 + lVar15 * 4 + 0x14) = uVar3;
                          uVar3 = vextractps_avx(auVar49,3);
                          *(undefined4 *)(*pauVar17 + lVar16 * 4 + 0x14) = uVar3;
                        }
                      }
                      else if (iVar26 == 4) {
                        *(undefined1 (*) [16])*pauVar17 = auVar99;
                        *(undefined1 (*) [16])(*pauVar17 + local_7e0 * 4) = auVar128;
                        if (iVar29 < iVar37) {
                          *(undefined1 (*) [16])(*pauVar17 + 0x10) = auVar95;
                          *(undefined1 (*) [16])(*pauVar17 + local_7e0 * 4 + 0x10) = auVar125;
                        }
                        if (iVar39 < iVar37) {
                          *(undefined1 (*) [16])pauVar17[1] = auVar84;
                          *(undefined1 (*) [16])(pauVar17[1] + local_7e0 * 4) = auVar122;
                        }
                        if (iVar23 < iVar37) {
                          *(undefined1 (*) [16])(pauVar17[1] + 0x10) = auVar78;
                          *(undefined1 (*) [16])(pauVar17[1] + local_7e0 * 4 + 0x10) = auVar100;
                        }
                        if (iVar35 < iVar37) {
                          *(undefined1 (*) [16])pauVar17[2] = auVar63;
                          *(undefined1 (*) [16])(pauVar17[2] + local_7e0 * 4) = auVar64;
                        }
                        if (iVar38 < iVar37) {
                          *(undefined1 (*) [16])(pauVar17[2] + 0x10) = auVar45;
                          *(undefined1 (*) [16])(pauVar17[2] + local_7e0 * 4 + 0x10) = auVar49;
                        }
                      }
                      else if (iVar26 == 8) {
                        *pauVar17 = auVar107;
                        if (iVar29 < iVar37) {
                          pauVar17[1] = auVar98;
                        }
                        if (iVar39 < iVar37) {
                          pauVar17[2] = auVar87;
                        }
                        if (iVar23 < iVar37) {
                          pauVar17[3] = auVar81;
                        }
                        if (iVar35 < iVar37) {
                          pauVar17[4] = auVar69;
                        }
                        if (iVar38 < iVar37) {
                          pauVar17[5] = auVar52;
                        }
                      }
                      pauVar17 = (undefined1 (*) [32])(*pauVar17 + (long)(iVar26 * iVar37) * 4);
                    }
                    lVar25 = lVar25 + 1;
                    pfVar21 = pfVar21 + 0x40;
                  } while (lVar25 != 6);
                  pfVar20 = pfVar20 + 8;
                  pvVar19 = (void *)((long)local_7d0 + 1U);
                } while ((void *)((long)local_7d0 + 1U) != pvVar27);
              }
              uVar28 = local_6d8 + 8;
              local_790 = (ulong)(uint)((int)local_790 + local_774);
              local_780 = pvVar27;
            } while (local_6d8 + 0xf < local_668);
          }
          if ((int)((uint)uVar28 | 3) < (int)uVar40) {
            local_7d0 = (void *)(long)(int)(uVar24 * 2);
            lVar12 = (long)(int)(uVar24 * 3);
            iVar39 = (uint)uVar28 * uVar41 * 0x40;
            local_7e0 = CONCAT44(local_7e0._4_4_,uVar41 * 0x100);
            local_7e8 = (void *)((long)local_7f0 + local_808 * 4);
            lVar13 = (long)(int)uVar24;
            local_850 = uVar28 & 0xffffffff;
            do {
              if (local_7f0 == (void *)0x0) {
                auVar45 = ZEXT816(0) << 0x40;
              }
              else {
                auVar45 = *(undefined1 (*) [16])((long)local_7e8 + local_850 * 4);
              }
              if (0 < (int)uVar41) {
                pfVar20 = (float *)((long)&local_7f8->data + (long)iVar39 * 4);
                pvVar19 = (void *)0x0;
                do {
                  iVar23 = (int)pvVar19 + iVar10;
                  lVar14 = -0x80;
                  pfVar21 = pfVar20;
                  do {
                    auVar49 = *(undefined1 (*) [16])(pfVar21 + (int)(uVar41 * 4));
                    auVar63 = *(undefined1 (*) [16])(pfVar21 + (int)(uVar41 * 8));
                    auVar64 = *(undefined1 (*) [16])(pfVar21 + (int)(uVar41 * 0xc));
                    auVar78 = *(undefined1 (*) [16])(pfVar21 + (int)(uVar41 << 4));
                    auVar100 = *(undefined1 (*) [16])(pfVar21 + (int)(uVar41 * 0x14));
                    auVar84 = *(undefined1 (*) [16])(pfVar21 + (int)(uVar41 * 0x18));
                    fVar115 = auVar63._0_4_ + auVar49._0_4_;
                    fVar117 = auVar63._4_4_ + auVar49._4_4_;
                    fVar119 = auVar63._8_4_ + auVar49._8_4_;
                    fVar62 = auVar63._12_4_ + auVar49._12_4_;
                    auVar49 = vsubps_avx(auVar49,auVar63);
                    fVar59 = auVar78._0_4_ + auVar64._0_4_;
                    fVar60 = auVar78._4_4_ + auVar64._4_4_;
                    fVar61 = auVar78._8_4_ + auVar64._8_4_;
                    fVar77 = auVar78._12_4_ + auVar64._12_4_;
                    auVar63 = vsubps_avx(auVar64,auVar78);
                    fVar82 = auVar84._0_4_ + auVar100._0_4_;
                    fVar109 = auVar84._4_4_ + auVar100._4_4_;
                    fVar111 = auVar84._8_4_ + auVar100._8_4_;
                    fVar113 = auVar84._12_4_ + auVar100._12_4_;
                    auVar64 = vsubps_avx(auVar100,auVar84);
                    auVar100._0_4_ = fVar82 * 32.0 + fVar59 + fVar115 + *pfVar21;
                    auVar100._4_4_ = fVar109 * 32.0 + fVar60 + fVar117 + pfVar21[1];
                    auVar100._8_4_ = fVar111 * 32.0 + fVar61 + fVar119 + pfVar21[2];
                    auVar100._12_4_ = fVar113 * 32.0 + fVar77 + fVar62 + pfVar21[3];
                    fVar44 = auVar63._0_4_;
                    fVar6 = auVar63._4_4_;
                    fVar48 = auVar63._8_4_;
                    fVar56 = auVar63._12_4_;
                    fVar43 = auVar49._0_4_;
                    fVar7 = auVar49._4_4_;
                    fVar54 = auVar49._8_4_;
                    fVar47 = auVar49._12_4_;
                    fVar53 = auVar64._0_4_;
                    fVar55 = auVar64._4_4_;
                    fVar57 = auVar64._8_4_;
                    fVar58 = auVar64._12_4_;
                    auVar122._0_4_ = fVar44 + fVar44 + fVar43 + fVar53 * 16.0;
                    auVar122._4_4_ = fVar6 + fVar6 + fVar7 + fVar55 * 16.0;
                    auVar122._8_4_ = fVar48 + fVar48 + fVar54 + fVar57 * 16.0;
                    auVar122._12_4_ = fVar56 + fVar56 + fVar47 + fVar58 * 16.0;
                    in_ZMM8 = ZEXT1664(auVar122);
                    auVar125._0_4_ = fVar59 * 4.0 + fVar115 + fVar82 * 8.0;
                    auVar125._4_4_ = fVar60 * 4.0 + fVar117 + fVar109 * 8.0;
                    auVar125._8_4_ = fVar61 * 4.0 + fVar119 + fVar111 * 8.0;
                    auVar125._12_4_ = fVar77 * 4.0 + fVar62 + fVar113 * 8.0;
                    in_ZMM9 = ZEXT1664(auVar125);
                    auVar128._0_4_ = fVar44 * 8.0 + fVar43 + fVar53 * 4.0;
                    auVar128._4_4_ = fVar6 * 8.0 + fVar7 + fVar55 * 4.0;
                    auVar128._8_4_ = fVar48 * 8.0 + fVar54 + fVar57 * 4.0;
                    auVar128._12_4_ = fVar56 * 8.0 + fVar47 + fVar58 * 4.0;
                    in_ZMM10 = ZEXT1664(auVar128);
                    auVar64._0_4_ = fVar59 * 16.0 + fVar115 + fVar82 + fVar82;
                    auVar64._4_4_ = fVar60 * 16.0 + fVar117 + fVar109 + fVar109;
                    auVar64._8_4_ = fVar61 * 16.0 + fVar119 + fVar111 + fVar111;
                    auVar64._12_4_ = fVar77 * 16.0 + fVar62 + fVar113 + fVar113;
                    pfVar36 = pfVar21 + (int)(uVar41 * 0x1c);
                    auVar49._0_4_ = fVar44 * 32.0 + fVar43 + *pfVar36 + fVar53;
                    auVar49._4_4_ = fVar6 * 32.0 + fVar7 + pfVar36[1] + fVar55;
                    auVar49._8_4_ = fVar48 * 32.0 + fVar54 + pfVar36[2] + fVar57;
                    auVar49._12_4_ = fVar56 * 32.0 + fVar47 + pfVar36[3] + fVar58;
                    *(undefined1 (*) [16])((long)local_5e0 + lVar14) = auVar100;
                    *(undefined1 (*) [16])((long)auStack_560 + lVar14) = auVar122;
                    *(undefined1 (*) [16])((long)auStack_4e0 + lVar14) = auVar125;
                    *(undefined1 (*) [16])(auStack_460 + lVar14) = auVar128;
                    *(undefined1 (*) [16])(auStack_3e0 + lVar14) = auVar64;
                    *(undefined1 (*) [16])(auStack_360 + lVar14) = auVar49;
                    pfVar21 = pfVar21 + (int)(uVar41 << 5);
                    lVar14 = lVar14 + 0x10;
                  } while (lVar14 != 0);
                  iVar29 = iVar23 % (int)uVar42;
                  lVar14 = (long)((iVar23 / (int)uVar42) * 6);
                  pauVar18 = (undefined1 (*) [16])
                             ((long)local_7c8->data +
                             (long)(iVar29 * 6 * iVar26) * 4 +
                             (long)local_7c8->w * local_7c8->elemsize * lVar14 +
                             local_7c8->cstep * (long)(((int)local_798 + (int)local_850) / iVar26) *
                             local_7c8->elemsize);
                  iVar30 = iVar29 * 6 + 1;
                  iVar23 = iVar29 * 6 + 2;
                  iVar35 = iVar29 * 6 + 3;
                  iVar38 = iVar29 * 6 + 4;
                  iVar29 = iVar29 * 6 + 5;
                  pfVar21 = local_600 + 4;
                  lVar15 = 0;
                  do {
                    if (lVar15 < local_7b0 - lVar14) {
                      auVar49 = *(undefined1 (*) [16])(pfVar21 + -0x18);
                      auVar63 = *(undefined1 (*) [16])(pfVar21 + -0x14);
                      auVar64 = *(undefined1 (*) [16])(pfVar21 + -0x10);
                      auVar78 = *(undefined1 (*) [16])(pfVar21 + -0xc);
                      auVar100 = *(undefined1 (*) [16])(pfVar21 + -8);
                      auVar84 = *(undefined1 (*) [16])(pfVar21 + -4);
                      auVar122 = vsubps_avx(auVar49,auVar63);
                      fVar59 = auVar78._0_4_ + auVar64._0_4_;
                      fVar60 = auVar78._4_4_ + auVar64._4_4_;
                      fVar61 = auVar78._8_4_ + auVar64._8_4_;
                      fVar77 = auVar78._12_4_ + auVar64._12_4_;
                      auVar64 = vsubps_avx(auVar64,auVar78);
                      in_ZMM9 = ZEXT1664(auVar64);
                      fVar82 = auVar84._0_4_ + auVar100._0_4_;
                      fVar109 = auVar84._4_4_ + auVar100._4_4_;
                      fVar111 = auVar84._8_4_ + auVar100._8_4_;
                      fVar113 = auVar84._12_4_ + auVar100._12_4_;
                      in_ZMM10 = ZEXT1664(CONCAT412(fVar113,CONCAT48(fVar111,CONCAT44(fVar109,fVar82
                                                                                     ))));
                      auVar78 = vsubps_avx(auVar100,auVar84);
                      fVar48 = auVar49._0_4_ + auVar45._0_4_ + auVar63._0_4_;
                      fVar54 = auVar49._4_4_ + auVar45._4_4_ + auVar63._4_4_;
                      fVar56 = auVar49._8_4_ + auVar45._8_4_ + auVar63._8_4_;
                      fVar47 = auVar49._12_4_ + auVar45._12_4_ + auVar63._12_4_;
                      auVar101._0_4_ = fVar48 + pfVar21[-0x1c] + fVar59 + fVar82 * 32.0;
                      auVar101._4_4_ = fVar54 + pfVar21[-0x1b] + fVar60 + fVar109 * 32.0;
                      auVar101._8_4_ = fVar56 + pfVar21[-0x1a] + fVar61 + fVar111 * 32.0;
                      auVar101._12_4_ = fVar47 + pfVar21[-0x19] + fVar77 + fVar113 * 32.0;
                      fVar44 = auVar64._0_4_;
                      fVar43 = auVar64._4_4_;
                      fVar6 = auVar64._8_4_;
                      fVar7 = auVar64._12_4_;
                      fVar115 = auVar78._0_4_;
                      fVar117 = auVar78._4_4_;
                      fVar119 = auVar78._8_4_;
                      fVar62 = auVar78._12_4_;
                      fVar53 = auVar122._0_4_ + auVar45._0_4_;
                      fVar55 = auVar122._4_4_ + auVar45._4_4_;
                      fVar57 = auVar122._8_4_ + auVar45._8_4_;
                      fVar58 = auVar122._12_4_ + auVar45._12_4_;
                      auVar96._0_4_ = fVar44 + fVar44 + fVar53 + fVar115 * 16.0;
                      auVar96._4_4_ = fVar43 + fVar43 + fVar55 + fVar117 * 16.0;
                      auVar96._8_4_ = fVar6 + fVar6 + fVar57 + fVar119 * 16.0;
                      auVar96._12_4_ = fVar7 + fVar7 + fVar58 + fVar62 * 16.0;
                      auVar85._0_4_ = fVar59 * 4.0 + fVar48 + fVar82 * 8.0;
                      auVar85._4_4_ = fVar60 * 4.0 + fVar54 + fVar109 * 8.0;
                      auVar85._8_4_ = fVar61 * 4.0 + fVar56 + fVar111 * 8.0;
                      auVar85._12_4_ = fVar77 * 4.0 + fVar47 + fVar113 * 8.0;
                      auVar79._0_4_ = fVar44 * 8.0 + fVar53 + fVar115 * 4.0;
                      auVar79._4_4_ = fVar43 * 8.0 + fVar55 + fVar117 * 4.0;
                      auVar79._8_4_ = fVar6 * 8.0 + fVar57 + fVar119 * 4.0;
                      auVar79._12_4_ = fVar7 * 8.0 + fVar58 + fVar62 * 4.0;
                      in_ZMM8 = ZEXT1664(CONCAT412(fVar113 + fVar113,
                                                   CONCAT48(fVar111 + fVar111,
                                                            CONCAT44(fVar109 + fVar109,
                                                                     fVar82 + fVar82))));
                      auVar65._0_4_ = fVar59 * 16.0 + fVar82 + fVar82 + fVar48;
                      auVar65._4_4_ = fVar60 * 16.0 + fVar109 + fVar109 + fVar54;
                      auVar65._8_4_ = fVar61 * 16.0 + fVar111 + fVar111 + fVar56;
                      auVar65._12_4_ = fVar77 * 16.0 + fVar113 + fVar113 + fVar47;
                      auVar50._0_4_ = fVar115 + fVar44 * 32.0 + fVar53 + *pfVar21;
                      auVar50._4_4_ = fVar117 + fVar43 * 32.0 + fVar55 + pfVar21[1];
                      auVar50._8_4_ = fVar119 + fVar6 * 32.0 + fVar57 + pfVar21[2];
                      auVar50._12_4_ = fVar62 + fVar7 * 32.0 + fVar58 + pfVar21[3];
                      if (iVar26 == 1) {
                        *(float *)*pauVar18 = auVar101._0_4_;
                        uVar3 = vextractps_avx(auVar101,1);
                        *(undefined4 *)(*pauVar18 + lVar13 * 4) = uVar3;
                        uVar3 = vextractps_avx(auVar101,2);
                        *(undefined4 *)(*pauVar18 + (long)local_7d0 * 4) = uVar3;
                        uVar3 = vextractps_avx(auVar101,3);
                        *(undefined4 *)(*pauVar18 + lVar12 * 4) = uVar3;
                        if (iVar30 < iVar37) {
                          *(float *)(*pauVar18 + 4) = auVar96._0_4_;
                          uVar3 = vextractps_avx(auVar96,1);
                          *(undefined4 *)(*pauVar18 + lVar13 * 4 + 4) = uVar3;
                          uVar3 = vextractps_avx(auVar96,2);
                          *(undefined4 *)(*pauVar18 + (long)local_7d0 * 4 + 4) = uVar3;
                          uVar3 = vextractps_avx(auVar96,3);
                          *(undefined4 *)(*pauVar18 + lVar12 * 4 + 4) = uVar3;
                        }
                        if (iVar23 < iVar37) {
                          *(float *)(*pauVar18 + 8) = auVar85._0_4_;
                          uVar3 = vextractps_avx(auVar85,1);
                          *(undefined4 *)(*pauVar18 + lVar13 * 4 + 8) = uVar3;
                          uVar3 = vextractps_avx(auVar85,2);
                          *(undefined4 *)(*pauVar18 + (long)local_7d0 * 4 + 8) = uVar3;
                          uVar3 = vextractps_avx(auVar85,3);
                          *(undefined4 *)(*pauVar18 + lVar12 * 4 + 8) = uVar3;
                        }
                        if (iVar35 < iVar37) {
                          *(float *)(*pauVar18 + 0xc) = auVar79._0_4_;
                          uVar3 = vextractps_avx(auVar79,1);
                          *(undefined4 *)(*pauVar18 + lVar13 * 4 + 0xc) = uVar3;
                          uVar3 = vextractps_avx(auVar79,2);
                          *(undefined4 *)(*pauVar18 + (long)local_7d0 * 4 + 0xc) = uVar3;
                          uVar3 = vextractps_avx(auVar79,3);
                          *(undefined4 *)(*pauVar18 + lVar12 * 4 + 0xc) = uVar3;
                        }
                        if (iVar38 < iVar37) {
                          *(float *)pauVar18[1] = auVar65._0_4_;
                          uVar3 = vextractps_avx(auVar65,1);
                          *(undefined4 *)(pauVar18[1] + lVar13 * 4) = uVar3;
                          uVar3 = vextractps_avx(auVar65,2);
                          *(undefined4 *)(pauVar18[1] + (long)local_7d0 * 4) = uVar3;
                          uVar3 = vextractps_avx(auVar65,3);
                          *(undefined4 *)(pauVar18[1] + lVar12 * 4) = uVar3;
                        }
                        if (iVar29 < iVar37) {
                          *(float *)(pauVar18[1] + 4) = auVar50._0_4_;
                          uVar3 = vextractps_avx(auVar50,1);
                          *(undefined4 *)(pauVar18[1] + lVar13 * 4 + 4) = uVar3;
                          uVar3 = vextractps_avx(auVar50,2);
                          *(undefined4 *)(pauVar18[1] + (long)local_7d0 * 4 + 4) = uVar3;
                          uVar3 = vextractps_avx(auVar50,3);
                          *(undefined4 *)(pauVar18[1] + lVar12 * 4 + 4) = uVar3;
                        }
                      }
                      else if (iVar26 == 4) {
                        *pauVar18 = auVar101;
                        if (iVar30 < iVar37) {
                          pauVar18[1] = auVar96;
                        }
                        if (iVar23 < iVar37) {
                          pauVar18[2] = auVar85;
                        }
                        if (iVar35 < iVar37) {
                          pauVar18[3] = auVar79;
                        }
                        if (iVar38 < iVar37) {
                          pauVar18[4] = auVar65;
                        }
                        if (iVar29 < iVar37) {
                          pauVar18[5] = auVar50;
                        }
                      }
                      pauVar18 = (undefined1 (*) [16])(*pauVar18 + (long)(iVar26 * iVar37) * 4);
                    }
                    lVar15 = lVar15 + 1;
                    pfVar21 = pfVar21 + 0x20;
                  } while (lVar15 != 6);
                  pvVar19 = (void *)((long)pvVar19 + 1);
                  pfVar20 = pfVar20 + 4;
                } while (pvVar19 != pvVar27);
              }
              uVar28 = local_850 + 4;
              lVar14 = local_850 + 7;
              iVar39 = iVar39 + uVar41 * 0x100;
              local_850 = uVar28;
            } while (lVar14 < local_788);
            uVar28 = uVar28 & 0xffffffff;
            local_7d8 = pvVar27;
          }
          auVar132 = ZEXT1664(CONCAT412(0x41800000,CONCAT48(0x41800000,0x4180000041800000)));
          uVar11 = (uint)uVar28;
          if ((int)(uVar11 | 1) < (int)uVar40) {
            local_7e8 = (void *)(local_7c8->cstep * local_7c8->elemsize);
            local_7d0 = (void *)((long)local_7c8->w * local_7c8->elemsize);
            iVar26 = uVar11 * uVar41 * 0x40;
            local_7e0 = CONCAT44(local_7e0._4_4_,uVar41 * 0x80);
            local_780 = local_7c8->data;
            local_850 = uVar28 & 0xffffffff;
            do {
              if (local_7f0 == (void *)0x0) {
                fVar43 = 0.0;
                fVar44 = 0.0;
              }
              else {
                fVar44 = *(float *)((long)local_7f0 + (local_808 + local_850) * 4);
                fVar43 = *(float *)((long)local_7f0 + (local_808 + local_850) * 4 + 4);
              }
              if (0 < (int)uVar41) {
                puVar32 = (undefined8 *)((long)&local_7f8->data + (long)iVar26 * 4);
                pvVar19 = (void *)0x0;
                do {
                  iVar39 = (int)pvVar19 + iVar10;
                  lVar12 = -0x40;
                  puVar33 = puVar32;
                  do {
                    uVar28 = *(ulong *)((long)puVar33 + (long)(int)(uVar41 * 2) * 4);
                    auVar80._8_8_ = 0;
                    auVar80._0_8_ = uVar28;
                    uVar1 = *(ulong *)((long)puVar33 + (long)(int)(uVar41 * 4) * 4);
                    auVar86._8_8_ = 0;
                    auVar86._0_8_ = uVar1;
                    fVar61 = (float)uVar1 + (float)uVar28;
                    fVar77 = (float)(uVar1 >> 0x20) + (float)(uVar28 >> 0x20);
                    uVar28 = *(ulong *)((long)puVar33 + (long)(int)(uVar41 * 6) * 4);
                    auVar97._8_8_ = 0;
                    auVar97._0_8_ = uVar28;
                    uVar1 = *(ulong *)((long)puVar33 + (long)(int)(uVar41 * 8) * 4);
                    auVar102._8_8_ = 0;
                    auVar102._0_8_ = uVar1;
                    fVar82 = (float)uVar1 + (float)uVar28;
                    fVar109 = (float)(uVar1 >> 0x20) + (float)(uVar28 >> 0x20);
                    uVar28 = *(ulong *)((long)puVar33 + (long)(int)(uVar41 * 10) * 4);
                    auVar123._8_8_ = 0;
                    auVar123._0_8_ = uVar28;
                    uVar1 = *(ulong *)((long)puVar33 + (long)(int)(uVar41 * 0xc) * 4);
                    auVar126._8_8_ = 0;
                    auVar126._0_8_ = uVar1;
                    in_ZMM9 = ZEXT1664(auVar126);
                    fVar111 = (float)uVar1 + (float)uVar28;
                    fVar113 = (float)(uVar1 >> 0x20) + (float)(uVar28 >> 0x20);
                    in_ZMM10 = ZEXT864(CONCAT44(fVar113,fVar111));
                    auVar130._0_4_ = fVar82 + fVar61 + (float)*puVar33 + fVar111 * 32.0;
                    auVar130._4_4_ =
                         fVar109 + fVar77 + (float)((ulong)*puVar33 >> 0x20) + fVar113 * 32.0;
                    auVar130._8_8_ = 0;
                    uVar2 = vmovlps_avx(auVar130);
                    *(undefined8 *)((long)local_620 + lVar12) = uVar2;
                    auVar45 = vsubps_avx(auVar80,auVar86);
                    auVar49 = vsubps_avx(auVar97,auVar102);
                    auVar63 = vsubps_avx(auVar123,auVar126);
                    fVar57 = auVar63._0_4_;
                    fVar58 = auVar63._4_4_;
                    fVar59 = auVar63._8_4_;
                    fVar60 = auVar63._12_4_;
                    fVar6 = auVar49._0_4_;
                    fVar48 = auVar49._4_4_;
                    fVar56 = auVar49._8_4_;
                    fVar53 = auVar49._12_4_;
                    fVar7 = auVar45._0_4_;
                    fVar54 = auVar45._4_4_;
                    fVar47 = auVar45._8_4_;
                    fVar55 = auVar45._12_4_;
                    auVar103._0_4_ = fVar6 + fVar6 + fVar7 + auVar132._0_4_ * fVar57;
                    auVar103._4_4_ = fVar48 + fVar48 + fVar54 + auVar132._4_4_ * fVar58;
                    auVar103._8_4_ = fVar56 + fVar56 + fVar47 + auVar132._8_4_ * fVar59;
                    auVar103._12_4_ = fVar53 + fVar53 + fVar55 + auVar132._12_4_ * fVar60;
                    uVar2 = vmovlps_avx(auVar103);
                    *(undefined8 *)((long)local_5e0 + lVar12) = uVar2;
                    auVar104._0_4_ = fVar111 * 8.0 + fVar82 * 4.0 + fVar61;
                    auVar104._4_4_ = fVar113 * 8.0 + fVar109 * 4.0 + fVar77;
                    auVar104._8_8_ = 0;
                    uVar2 = vmovlps_avx(auVar104);
                    *(undefined8 *)((long)local_5a0 + lVar12) = uVar2;
                    in_ZMM8 = ZEXT1664(CONCAT412(fVar60 * 4.0,
                                                 CONCAT48(fVar59 * 4.0,
                                                          CONCAT44(fVar58 * 4.0,fVar57 * 4.0))));
                    auVar105._0_4_ = fVar57 * 4.0 + fVar6 * 8.0 + fVar7;
                    auVar105._4_4_ = fVar58 * 4.0 + fVar48 * 8.0 + fVar54;
                    auVar105._8_4_ = fVar59 * 4.0 + fVar56 * 8.0 + fVar47;
                    auVar105._12_4_ = fVar60 * 4.0 + fVar53 * 8.0 + fVar55;
                    uVar2 = vmovlps_avx(auVar105);
                    *(undefined8 *)((long)auStack_560 + lVar12) = uVar2;
                    auVar66._0_4_ = auVar132._0_4_ * fVar82 + fVar61 + fVar111 + fVar111;
                    auVar66._4_4_ = auVar132._4_4_ * fVar109 + fVar77 + fVar113 + fVar113;
                    auVar66._8_4_ = auVar132._8_4_ * 0.0 + 0.0;
                    auVar66._12_4_ = auVar132._12_4_ * 0.0 + 0.0;
                    uVar2 = vmovlps_avx(auVar66);
                    *(undefined8 *)((long)auStack_520 + lVar12) = uVar2;
                    uVar2 = *(undefined8 *)((long)puVar33 + (long)(int)(uVar41 * 0xe) * 4);
                    auVar67._0_4_ = fVar6 * 32.0 + fVar7 + fVar57 + (float)uVar2;
                    auVar67._4_4_ = fVar48 * 32.0 + fVar54 + fVar58 + (float)((ulong)uVar2 >> 0x20);
                    auVar67._8_4_ = fVar56 * 32.0 + fVar47 + fVar59 + 0.0;
                    auVar67._12_4_ = fVar53 * 32.0 + fVar55 + fVar60 + 0.0;
                    uVar2 = vmovlps_avx(auVar67);
                    *(undefined8 *)((long)auStack_4e0 + lVar12) = uVar2;
                    puVar33 = (undefined8 *)((long)puVar33 + (long)(int)(uVar41 * 0x10) * 4);
                    lVar12 = lVar12 + 8;
                  } while (lVar12 != 0);
                  iVar23 = iVar39 % (int)uVar42;
                  lVar12 = (long)((iVar39 / (int)uVar42) * 6);
                  pfVar20 = (float *)((long)local_780 +
                                     (long)(iVar23 * 6) * 4 +
                                     (long)local_7d0 * lVar12 +
                                     (local_808 + local_850) * (long)local_7e8);
                  pfVar21 = &fStack_624;
                  lVar13 = 0;
                  do {
                    if (lVar13 < local_7b0 - lVar12) {
                      fVar54 = pfVar21[-7] + pfVar21[-9];
                      fVar56 = pfVar21[-6] + pfVar21[-8];
                      fVar60 = pfVar21[-9] - pfVar21[-7];
                      fVar61 = pfVar21[-8] - pfVar21[-6];
                      fVar47 = pfVar21[-3] + pfVar21[-5];
                      fVar53 = pfVar21[-4] + pfVar21[-2];
                      fVar77 = pfVar21[-5] - pfVar21[-3];
                      fVar82 = pfVar21[-4] - pfVar21[-2];
                      fVar55 = pfVar21[-0xb] + fVar44 + pfVar21[-0xd];
                      fVar57 = pfVar21[-10] + fVar43 + pfVar21[-0xc];
                      fVar58 = fVar44 + (pfVar21[-0xd] - pfVar21[-0xb]);
                      fVar59 = fVar43 + (pfVar21[-0xc] - pfVar21[-10]);
                      in_ZMM10 = ZEXT464((uint)fVar56);
                      fVar6 = pfVar21[-1];
                      fVar7 = *pfVar21;
                      fVar48 = pfVar21[-0xe];
                      *pfVar20 = fVar55 + pfVar21[-0xf] + fVar54 + fVar47 * 32.0;
                      pfVar20[(int)uVar24] = fVar56 + fVar53 * 32.0 + fVar57 + fVar48;
                      if (iVar23 * 6 + 1 < iVar37) {
                        pfVar20[1] = fVar60 + fVar60 + fVar58 + fVar77 * 16.0;
                        pfVar20[(long)(int)uVar24 + 1] = fVar59 + fVar61 + fVar61 + fVar82 * 16.0;
                      }
                      if (iVar23 * 6 + 2 < iVar37) {
                        pfVar20[2] = fVar54 * 4.0 + fVar55 + fVar47 * 8.0;
                        pfVar20[(long)(int)uVar24 + 2] = fVar53 * 8.0 + fVar56 * 4.0 + fVar57;
                      }
                      in_ZMM9 = ZEXT464(0);
                      if (iVar23 * 6 + 3 < iVar37) {
                        in_ZMM9 = ZEXT464(0x41000000);
                        pfVar20[3] = fVar58 + fVar60 * 8.0 + fVar77 * 4.0;
                        pfVar20[(long)(int)uVar24 + 3] = fVar82 * 4.0 + fVar59 + fVar61 * 8.0;
                      }
                      in_ZMM8 = ZEXT464(0);
                      if (iVar23 * 6 + 4 < iVar37) {
                        pfVar20[4] = fVar54 * 16.0 + fVar55 + fVar47 + fVar47;
                        pfVar20[(long)(int)uVar24 + 4] = fVar56 * 16.0 + fVar57 + fVar53 + fVar53;
                      }
                      auVar132 = ZEXT1664(CONCAT412(0x41800000,
                                                    CONCAT48(0x41800000,0x4180000041800000)));
                      if (iVar23 * 6 + 5 < iVar37) {
                        pfVar20[5] = fVar60 * 32.0 + fVar58 + fVar77 + fVar6;
                        pfVar20[(long)(int)uVar24 + 5] = fVar59 + fVar82 + fVar61 * 32.0 + fVar7;
                      }
                      pfVar20 = pfVar20 + iVar37;
                    }
                    lVar13 = lVar13 + 1;
                    pfVar21 = pfVar21 + 0x10;
                  } while (lVar13 != 6);
                  pvVar19 = (void *)((long)pvVar19 + 1);
                  puVar32 = puVar32 + 1;
                } while (pvVar19 != pvVar27);
              }
              uVar28 = local_850 + 2;
              lVar12 = local_850 + 3;
              iVar26 = iVar26 + uVar41 * 0x80;
              local_850 = uVar28;
            } while (lVar12 < local_788);
            uVar11 = (uint)uVar28;
            local_7d8 = pvVar27;
          }
          in_ZMM11 = ZEXT464(0x42000000);
          if ((int)uVar11 < (int)uVar40) {
            iVar26 = local_7c8->w;
            pvVar19 = local_7c8->data;
            sVar4 = local_7c8->elemsize;
            sVar5 = local_7c8->cstep;
            local_880 = (long)(int)uVar11;
            iVar39 = uVar11 * uVar41 * 0x40;
            do {
              if (local_7f0 == (void *)0x0) {
                fVar44 = 0.0;
              }
              else {
                fVar44 = *(float *)((long)local_7f0 + local_880 * 4 + local_808 * 4);
              }
              if (0 < (int)uVar41) {
                pfVar20 = (float *)((long)&local_7f8->data + (long)iVar39 * 4);
                pvVar22 = (void *)0x0;
                do {
                  iVar23 = (int)pvVar22 + iVar10;
                  lVar12 = -0x20;
                  pfVar21 = pfVar20;
                  do {
                    fVar43 = pfVar21[(int)(uVar41 * 2)] + pfVar21[(int)uVar41];
                    fVar48 = pfVar21[(int)uVar41] - pfVar21[(int)(uVar41 * 2)];
                    fVar6 = pfVar21[(int)(uVar41 * 4)] + pfVar21[(int)(uVar41 * 3)];
                    fVar54 = pfVar21[(int)(uVar41 * 3)] - pfVar21[(int)(uVar41 * 4)];
                    fVar7 = pfVar21[(int)(uVar41 * 6)] + pfVar21[(int)(uVar41 * 5)];
                    fVar56 = pfVar21[(int)(uVar41 * 5)] - pfVar21[(int)(uVar41 * 6)];
                    *(float *)((long)&local_640 + lVar12) = fVar7 * 32.0 + fVar6 + fVar43 + *pfVar21
                    ;
                    *(float *)((long)local_620 + lVar12) = fVar54 + fVar54 + fVar48 + fVar56 * 16.0;
                    *(float *)((long)local_600 + lVar12) = fVar7 * 8.0 + fVar6 * 4.0 + fVar43;
                    in_ZMM8 = ZEXT464((uint)(fVar56 * 4.0));
                    *(float *)((long)local_5e0 + lVar12) = fVar56 * 4.0 + fVar54 * 8.0 + fVar48;
                    *(float *)((long)local_5c0 + lVar12) = fVar6 * 16.0 + fVar43 + fVar7 + fVar7;
                    *(float *)((long)local_5a0 + lVar12) =
                         fVar54 * 32.0 + fVar48 + fVar56 + pfVar21[(int)(uVar41 * 7)];
                    pfVar21 = pfVar21 + (int)(uVar41 * 8);
                    lVar12 = lVar12 + 4;
                  } while (lVar12 != 0);
                  iVar35 = iVar23 % (int)uVar42;
                  lVar12 = (long)((iVar23 / (int)uVar42) * 6);
                  pfVar21 = (float *)((long)pvVar19 +
                                     (long)(iVar35 * 6) * 4 +
                                     (long)iVar26 * sVar4 * lVar12 +
                                     (local_808 + local_880) * sVar5 * sVar4);
                  pfVar36 = afStack_658 + 5;
                  lVar13 = 0;
                  do {
                    if (lVar13 < local_7b0 - lVar12) {
                      fVar6 = pfVar36[-3] + pfVar36[-4];
                      fVar56 = pfVar36[-4] - pfVar36[-3];
                      fVar7 = pfVar36[-1] + pfVar36[-2];
                      fVar47 = pfVar36[-2] - pfVar36[-1];
                      fVar48 = pfVar36[-6] + fVar44 + pfVar36[-5];
                      fVar54 = (pfVar36[-6] - pfVar36[-5]) + fVar44;
                      fVar43 = *pfVar36;
                      *pfVar21 = fVar48 + pfVar36[-7] + fVar6 + fVar7 * 32.0;
                      if (iVar35 * 6 + 1 < iVar37) {
                        pfVar21[1] = fVar56 + fVar56 + fVar54 + fVar47 * 16.0;
                      }
                      in_ZMM10 = ZEXT464(0);
                      if (iVar35 * 6 + 2 < iVar37) {
                        pfVar21[2] = fVar6 * 4.0 + fVar48 + fVar7 * 8.0;
                      }
                      in_ZMM9 = ZEXT464(0);
                      in_ZMM8 = ZEXT464(0);
                      if (iVar35 * 6 + 3 < iVar37) {
                        pfVar21[3] = fVar56 * 8.0 + fVar54 + fVar47 * 4.0;
                      }
                      if (iVar35 * 6 + 4 < iVar37) {
                        pfVar21[4] = fVar6 * 16.0 + fVar48 + fVar7 + fVar7;
                      }
                      if (iVar35 * 6 + 5 < iVar37) {
                        pfVar21[5] = fVar56 * 32.0 + fVar54 + fVar43 + fVar47;
                      }
                      pfVar21 = pfVar21 + iVar37;
                    }
                    lVar13 = lVar13 + 1;
                    pfVar36 = pfVar36 + 8;
                  } while (lVar13 != 6);
                  pvVar22 = (void *)((long)pvVar22 + 1);
                  pfVar20 = pfVar20 + 1;
                } while (pvVar22 != pvVar27);
              }
              local_880 = local_880 + 1;
              iVar39 = iVar39 + local_7bc;
            } while (local_880 != local_788);
          }
          iVar10 = iVar10 + local_7b4;
          uVar28 = local_800;
          uVar42 = local_7b4;
        } while (iVar10 < (int)local_800);
      }
      local_810 = local_810 + 1;
    } while (local_810 != local_7c0);
  }
  piVar8 = (int *)CONCAT44(local_770.refcount._4_4_,(int)local_770.refcount);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_770.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_770.data != (Allocator *)0x0) {
          free(local_770.data);
        }
      }
      else {
        (*(local_770.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar8 = (int *)CONCAT44(local_720.refcount._4_4_,local_720.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_720.allocator == (Allocator *)0x0) {
        if (local_720.data != (void *)0x0) {
          free(local_720.data);
        }
      }
      else {
        (*(local_720.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63(const Mat& bottom_blob, Mat& top_blob, const Mat& AT, const Mat& bias, int nT, const Option& opt)
{
    int outw = top_blob.w;
    int outh = top_blob.h;

    // pad to 6n+2, winograd F(6,3)
    int w_tiles = (outw + 5) / 6;
    int h_tiles = (outh + 5) / 6;
    int tiles = w_tiles * h_tiles;

    const int M = top_blob.c * top_blob.elempack;
    const int N = tiles;
    const int K = bottom_blob.c * bottom_blob.elempack;
    const int B = 64;

    // NCNN_LOGE("conv3x3s1_winograd63 %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, N, K, TILE_M, TILE_N, TILE_K, nT);

    const int nn_M = (M + TILE_M - 1) / TILE_M;
    const int nn_N = (N + TILE_N - 1) / TILE_N;
    const int nn_K = (K + TILE_K - 1) / TILE_K;

    // NCNN_LOGE("TILE M/N/K = %d %d %d -> %d %d %d", M, N, K, TILE_M, TILE_N, TILE_K);

    Mat BT(TILE_K * TILE_N, B, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, opt.workspace_allocator);

    const int nn_NK = nn_N * nn_K;

    if (nT > 1 && nn_NK < nT)
    {
        Mat B_tile(TILE_N * B * TILE_K, 4u, opt.workspace_allocator);

        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            // transform input
            conv3x3s1_winograd63_transform_input_tile(bottom_blob, B_tile, j, max_jj, k, max_kk, nT);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile(B_tile, BT_tile, B, max_jj, max_kk, nT);
        }
    }
    else
    {
        Mat B_tileX(TILE_N * B * TILE_K, 1, nT, 4u, opt.workspace_allocator);

        #pragma omp parallel for num_threads(nT)
        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            Mat B_tile = B_tileX.channel(get_omp_thread_num());

            // transform input
            conv3x3s1_winograd63_transform_input_tile(bottom_blob, B_tile, j, max_jj, k, max_kk, 1);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile(B_tile, BT_tile, B, max_jj, max_kk, 1);
        }
    }

    Mat top_tileX(TILE_N * B * TILE_M, 1, nT, 4u, opt.workspace_allocator);

    #pragma omp parallel for num_threads(nT)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat top_tile = top_tileX.channel(get_omp_thread_num());

        const int max_ii = std::min((M - i), TILE_M);

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                const Mat AT_tile = AT.channel(i / TILE_M).depth(k / TILE_K);

                const Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

                gemm_transB_packed_tile(AT_tile, BT_tile, top_tile, B, max_ii, max_jj, k, max_kk);
            }

            // transform output
            conv3x3s1_winograd63_transform_output_tile(top_tile, top_blob, bias, i, max_ii, j, max_jj);
        }
    }
}